

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

CTInfo lj_ctype_info(CTState *cts,CTypeID id,CTSize *szp)

{
  uint uVar1;
  CTSize local_78;
  CType *pCStack_70;
  CTInfo info;
  CType *ct;
  CTInfo qual;
  CTSize *szp_local;
  CTypeID id_local;
  CTState *cts_local;
  
  ct._4_4_ = 0;
  pCStack_70 = cts->tab + id;
  do {
    uVar1 = pCStack_70->info;
    if (uVar1 >> 0x1c != 5) {
      if (uVar1 >> 0x1c != 8) {
        if ((ct._4_4_ & 1) == 0) {
          ct._4_4_ = uVar1 & 0xf0000 | ct._4_4_;
        }
        if (uVar1 >> 0x1c == 6) {
          local_78 = 0xffffffff;
        }
        else {
          local_78 = pCStack_70->size;
        }
        *szp = local_78;
        return uVar1 & 0xfff00000 | ct._4_4_;
      }
      if ((uVar1 & 0xf0ff0000) == 0x80010000) {
        ct._4_4_ = pCStack_70->size | ct._4_4_;
      }
      else if (((uVar1 & 0xf0ff0000) == 0x80020000) && ((ct._4_4_ & 1) == 0)) {
        ct._4_4_ = pCStack_70->size * 0x10000 + 1 | ct._4_4_;
      }
    }
    pCStack_70 = cts->tab + (uVar1 & 0xffff);
  } while( true );
}

Assistant:

CTInfo lj_ctype_info(CTState *cts, CTypeID id, CTSize *szp)
{
  CTInfo qual = 0;
  CType *ct = ctype_get(cts, id);
  for (;;) {
    CTInfo info = ct->info;
    if (ctype_isenum(info)) {
      /* Follow child. Need to look at its attributes, too. */
    } else if (ctype_isattrib(info)) {
      if (ctype_isxattrib(info, CTA_QUAL))
	qual |= ct->size;
      else if (ctype_isxattrib(info, CTA_ALIGN) && !(qual & CTFP_ALIGNED))
	qual |= CTFP_ALIGNED + CTALIGN(ct->size);
    } else {
      if (!(qual & CTFP_ALIGNED)) qual |= (info & CTF_ALIGN);
      qual |= (info & ~(CTF_ALIGN|CTMASK_CID));
      lj_assertCTS(ctype_hassize(info) || ctype_isfunc(info),
		   "ctype without size");
      *szp = ctype_isfunc(info) ? CTSIZE_INVALID : ct->size;
      break;
    }
    ct = ctype_get(cts, ctype_cid(info));
  }
  return qual;
}